

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

long file_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  int iVar1;
  FILE *pFVar2;
  uint uVar3;
  FILE **out;
  char *mode;
  FILE *fp;
  void *ptr_local;
  long num_local;
  int cmd_local;
  BIO *b_local;
  
  pFVar2 = (FILE *)b->ptr;
  if (cmd == 1) {
    ptr_local = (void *)0x0;
LAB_001e7e37:
    iVar1 = fseek(pFVar2,(long)ptr_local,0);
    b_local = (BIO *)(long)iVar1;
  }
  else {
    if (cmd == 2) {
      iVar1 = feof(pFVar2);
      return (long)iVar1;
    }
    if (cmd != 3) {
      if (cmd == 8) {
        return (long)b->shutdown;
      }
      uVar3 = (uint)num;
      if (cmd == 9) {
        b->shutdown = uVar3;
        return 1;
      }
      if (cmd == 0xb) {
        iVar1 = fflush(pFVar2);
        return (ulong)(iVar1 == 0);
      }
      if (cmd == 0x6a) {
        file_free(b);
        b->shutdown = uVar3 & 1;
        b->ptr = ptr;
        b->init = 1;
        return 1;
      }
      if (cmd == 0x6b) {
        if (ptr != (void *)0x0) {
          *(FILE **)ptr = pFVar2;
        }
        return 1;
      }
      if (cmd == 0x6c) {
        file_free(b);
        b->shutdown = uVar3 & 1;
        if ((num & 8U) == 0) {
          if (((num & 2U) == 0) || ((num & 4U) == 0)) {
            if ((num & 4U) == 0) {
              if ((num & 2U) == 0) {
                ERR_put_error(0x11,0,100,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                              ,0xbb);
                return 0;
              }
              out = (FILE **)anon_var_dwarf_1d3d8e;
            }
            else {
              out = (FILE **)anon_var_dwarf_1d3d84;
            }
          }
          else {
            out = (FILE **)anon_var_dwarf_1d3d7a;
          }
        }
        else if ((num & 2U) == 0) {
          out = (FILE **)anon_var_dwarf_1d3d70;
        }
        else {
          out = (FILE **)anon_var_dwarf_1d3d66;
        }
        pFVar2 = fopen64((char *)ptr,(char *)out);
        if (pFVar2 == (FILE *)0x0) {
          ERR_put_error(2,0,0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                        ,0xc0);
          ERR_add_error_data(5,"fopen(\'",ptr,"\',\'",out,"\')");
          ERR_put_error(0x11,0,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                        ,0xc2);
          return 0;
        }
        b->ptr = pFVar2;
        b->init = 1;
        return 1;
      }
      ptr_local = (void *)num;
      if (cmd == 0x80) goto LAB_001e7e37;
      if (cmd != 0x85) {
        return 0;
      }
    }
    b_local = (BIO *)ftell(pFVar2);
  }
  return (long)b_local;
}

Assistant:

static long file_ctrl(BIO *b, int cmd, long num, void *ptr) {
  FILE *fp = static_cast<FILE *>(b->ptr);
  switch (cmd) {
    case BIO_CTRL_RESET:
      num = 0;
      [[fallthrough]];
    case BIO_C_FILE_SEEK:
      return fseek(fp, num, 0);
    case BIO_CTRL_EOF:
      return feof(fp);
    case BIO_C_FILE_TELL:
    case BIO_CTRL_INFO:
      return ftell(fp);
    case BIO_C_SET_FILE_PTR:
      file_free(b);
      static_assert((BIO_CLOSE & BIO_FP_TEXT) == 0,
                    "BIO_CLOSE and BIO_FP_TEXT must not collide");
#if defined(OPENSSL_WINDOWS)
      // If |BIO_FP_TEXT| is not set, OpenSSL will switch the file to binary
      // mode. BoringSSL intentionally diverges here because it means code
      // tested under POSIX will inadvertently change the state of |FILE|
      // objects when wrapping them in a |BIO|.
      if (num & BIO_FP_TEXT) {
        _setmode(_fileno(reinterpret_cast<FILE *>(ptr)), _O_TEXT);
      }
#endif
      b->shutdown = static_cast<int>(num) & BIO_CLOSE;
      b->ptr = ptr;
      b->init = 1;
      return 1;
    case BIO_C_SET_FILENAME:
      file_free(b);
      b->shutdown = static_cast<int>(num) & BIO_CLOSE;
      const char *mode;
      if (num & BIO_FP_APPEND) {
        if (num & BIO_FP_READ) {
          mode = "ab+";
        } else {
          mode = "ab";
        }
      } else if ((num & BIO_FP_READ) && (num & BIO_FP_WRITE)) {
        mode = "rb+";
      } else if (num & BIO_FP_WRITE) {
        mode = "wb";
      } else if (num & BIO_FP_READ) {
        mode = "rb";
      } else {
        OPENSSL_PUT_ERROR(BIO, BIO_R_BAD_FOPEN_MODE);
        return 0;
      }
      fp = fopen_if_available(reinterpret_cast<const char *>(ptr), mode);
      if (fp == nullptr) {
        OPENSSL_PUT_SYSTEM_ERROR();
        ERR_add_error_data(5, "fopen('", ptr, "','", mode, "')");
        OPENSSL_PUT_ERROR(BIO, ERR_R_SYS_LIB);
        return 0;
      }
      b->ptr = fp;
      b->init = 1;
      return 1;
    case BIO_C_GET_FILE_PTR:
      // the ptr parameter is actually a FILE ** in this case.
      if (ptr != nullptr) {
        FILE **out = static_cast<FILE **>(ptr);
        *out = fp;
      }
      return 1;
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return fflush(fp) == 0;
    default:
      return 0;
  }
}